

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<CborValue>::reallocate
          (QPodArrayOps<CborValue> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<CborValue>_*,_CborValue_*> pVar1;
  
  pVar1 = QTypedArrayData<CborValue>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<CborValue>).d,
                     (this->super_QArrayDataPointer<CborValue>).ptr,alloc,option);
  if (pVar1.second != (CborValue *)0x0) {
    (this->super_QArrayDataPointer<CborValue>).d = pVar1.first;
    (this->super_QArrayDataPointer<CborValue>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }